

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_fuzzer.cc
# Opt level: O1

void __thiscall FuzzHelper::testWrite(FuzzHelper *this)

{
  __uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  __uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> this_03;
  __uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  shared_ptr<QPDFWriter> local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  getQpdf((FuzzHelper *)&local_48);
  this_01 = p_Stack_40;
  local_28._M_allocated_capacity =
       (size_type)
       local_48._M_t.
       super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
       super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (tuple<Buffer::Members_*,_std::default_delete<Buffer::Members>_>)
       (_Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>)0x0;
  local_28._8_8_ = this_01;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  getWriter((FuzzHelper *)&local_48,(shared_ptr<QPDF> *)this);
  this_02 = p_Stack_40;
  this_00._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       local_48._M_t.
       super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
       super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (tuple<Buffer::Members_*,_std::default_delete<Buffer::Members>_>)
       (_Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  QPDFWriter::setDeterministicID
            ((QPDFWriter *)
             this_00._M_t.
             super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
             super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl,true);
  this_03._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       this_00._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
       .super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl;
  QPDFWriter::setQDFMode
            ((QPDFWriter *)
             this_00._M_t.
             super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
             super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl,true);
  local_38.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       this_00._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
       .super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl;
  local_38.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_02;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  doWrite((FuzzHelper *)
          this_03._M_t.
          super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
          super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl,&local_38);
  if (local_38.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void
FuzzHelper::testWrite()
{
    // Write in various ways to exercise QPDFWriter

    std::shared_ptr<QPDF> q;
    std::shared_ptr<QPDFWriter> w;

    q = getQpdf();
    w = getWriter(q);
    w->setDeterministicID(true);
    w->setQDFMode(true);
    doWrite(w);
}